

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connection.cpp
# Opt level: O2

void __thiscall
cube::net::TcpConnection::ReadUntil(TcpConnection *this,string *delimiter,ReadCallback *cb)

{
  EventLoop *this_00;
  uint __line;
  char *pcVar1;
  _Bind<std::function<void_(std::shared_ptr<cube::net::TcpConnection>,_cube::Buffer_*)>_(std::shared_ptr<cube::net::TcpConnection>,_cube::Buffer_*)>
  local_a0;
  Task local_68;
  Buffer *local_48;
  __shared_ptr<cube::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
    pcVar1 = "cb";
    __line = 0x4a;
  }
  else {
    if (delimiter->_M_string_length != 0) {
      if (this->m_state != ConnState_Disconnected) {
        pcVar1 = Buffer::Find(&this->m_input_buffer,delimiter);
        if (pcVar1 == (char *)0x0) {
          std::__cxx11::string::_M_assign((string *)&this->m_read_delimiter);
          std::function<void_(std::shared_ptr<cube::net::TcpConnection>,_cube::Buffer_*)>::operator=
                    (&this->m_read_callback,cb);
          if ((((this->m_eventor)._M_t.
                super___uniq_ptr_impl<cube::net::Eventor,_std::default_delete<cube::net::Eventor>_>.
                _M_t.
                super__Tuple_impl<0UL,_cube::net::Eventor_*,_std::default_delete<cube::net::Eventor>_>
                .super__Head_base<0UL,_cube::net::Eventor_*,_false>._M_head_impl)->m_events & 1) ==
              0) {
            EnableReading(this);
            return;
          }
        }
        else {
          this_00 = this->m_event_loop;
          std::__shared_ptr<cube::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<cube::net::TcpConnection,void>
                    (local_40,(__weak_ptr<cube::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
                              this);
          local_48 = &this->m_input_buffer;
          std::
          _Bind<std::function<void(std::shared_ptr<cube::net::TcpConnection>,cube::Buffer*)>(std::shared_ptr<cube::net::TcpConnection>,cube::Buffer*)>
          ::_Bind<std::shared_ptr<cube::net::TcpConnection>,cube::Buffer*>
                    ((_Bind<std::function<void(std::shared_ptr<cube::net::TcpConnection>,cube::Buffer*)>(std::shared_ptr<cube::net::TcpConnection>,cube::Buffer*)>
                      *)&local_a0,cb,(shared_ptr<cube::net::TcpConnection> *)local_40,&local_48);
          std::function<void()>::
          function<std::_Bind<std::function<void(std::shared_ptr<cube::net::TcpConnection>,cube::Buffer*)>(std::shared_ptr<cube::net::TcpConnection>,cube::Buffer*)>,void>
                    ((function<void()> *)&local_68,&local_a0);
          EventLoop::Post(this_00,&local_68);
          std::_Function_base::~_Function_base(&local_68.super__Function_base);
          std::
          _Bind<std::function<void_(std::shared_ptr<cube::net::TcpConnection>,_cube::Buffer_*)>_(std::shared_ptr<cube::net::TcpConnection>,_cube::Buffer_*)>
          ::~_Bind(&local_a0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
        }
      }
      return;
    }
    pcVar1 = "!delimiter.empty()";
    __line = 0x4b;
  }
  __assert_fail(pcVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/yplusplus[P]cube/net/tcp_connection.cpp"
                ,__line,
                "void cube::net::TcpConnection::ReadUntil(const std::string &, const ReadCallback &)"
               );
}

Assistant:

void TcpConnection::ReadUntil(const std::string &delimiter, const ReadCallback &cb) {
    assert(cb);
    assert(!delimiter.empty());
    if (Closed()) return;
    if (m_input_buffer.Find(delimiter) != NULL) {
        m_event_loop->Post(std::bind(cb, shared_from_this(), &m_input_buffer));
        return;
    }
    m_read_delimiter = delimiter;
    m_read_callback = cb;
    if (!m_eventor->Reading()) {
        EnableReading();
    }
    return;
}